

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DarknetUtility.cpp
# Opt level: O0

void __thiscall
DarknetUtility::drawPred
          (DarknetUtility *this,int classId,float conf,int left,int top,int right,int bottom,
          Mat *frame)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference __lhs;
  int *piVar4;
  undefined1 auVar5 [12];
  Scalar_<double> local_1a0;
  Point_<int> local_180;
  _InputOutputArray local_178;
  Scalar_<double> local_160;
  Point_<int> local_140;
  Point_<int> local_138;
  _InputOutputArray local_130;
  int local_114;
  int local_110;
  Size labelSize;
  int baseLine;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  string label;
  Point_<int> local_5c;
  undefined4 local_54;
  undefined8 local_50;
  Point_<int> local_48;
  _InputOutputArray local_40;
  int local_28;
  int local_24;
  int bottom_local;
  int right_local;
  int top_local;
  int left_local;
  float conf_local;
  int classId_local;
  DarknetUtility *this_local;
  
  local_28 = bottom;
  local_24 = right;
  bottom_local = top;
  right_local = left;
  top_local = (int)conf;
  left_local = classId;
  _conf_local = this;
  cv::_InputOutputArray::_InputOutputArray(&local_40,frame);
  cv::Point_<int>::Point_(&local_48,right_local,bottom_local);
  cv::Point_<int>::Point_(&local_5c,local_24,local_28);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)((long)&label.field_2 + 8),0.0,255.0,0.0,0.0);
  cv::rectangle(&local_40,&local_48,&local_5c,(undefined1 *)((long)&label.field_2 + 8),1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_40);
  cv::format_abi_cxx11_(local_a0,(double)(float)top_local,"%.2f");
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->classes);
  iVar1 = left_local;
  if (!bVar2) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->classes);
    if ((int)sVar3 <= iVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"classId < (int)classes.size()",&local_c1);
      auVar5 = cv::error(-0xd7,local_c0,"drawPred",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/DimasVeliz[P]OpenCvDnnPythonAndBasicCpp/darknetUtility/src/DarknetUtility.cpp"
                         ,0x54);
      local_54 = auVar5._8_4_;
      local_50 = auVar5._0_8_;
      std::allocator<char>::~allocator(&local_c1);
      std::__cxx11::string::~string((string *)local_a0);
      _Unwind_Resume(local_50);
    }
    __lhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->classes,(long)left_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &labelSize.height,__lhs,": ");
    std::operator+(&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &labelSize.height,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    std::__cxx11::string::operator=((string *)local_a0,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&labelSize.height);
  }
  cv::getTextSize((string *)&local_114,(int)local_a0,0.5,0,(int *)0x1);
  piVar4 = std::max<int>(&bottom_local,&local_110);
  bottom_local = *piVar4;
  cv::_InputOutputArray::_InputOutputArray(&local_130,frame);
  cv::Point_<int>::Point_(&local_138,right_local,bottom_local - local_110);
  cv::Point_<int>::Point_(&local_140,right_local + local_114,bottom_local + labelSize.width);
  cv::Scalar_<double>::all(&local_160,255.0);
  cv::rectangle(&local_130,&local_138,&local_140,&local_160,0xffffffff,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_130);
  cv::_InputOutputArray::_InputOutputArray(&local_178,frame);
  cv::Point_<int>::Point_(&local_180,right_local,bottom_local);
  cv::Scalar_<double>::Scalar_(&local_1a0);
  cv::putText(0x3fe0000000000000,&local_178,local_a0,&local_180,0,&local_1a0,1,8,0);
  cv::_InputOutputArray::~_InputOutputArray(&local_178);
  std::__cxx11::string::~string((string *)local_a0);
  return;
}

Assistant:

void DarknetUtility::drawPred(int classId, float conf, int left, int top, int right, int bottom, Mat &frame)
{
    rectangle(frame, Point(left, top), Point(right, bottom), Scalar(0, 255, 0));
    std::string label = format("%.2f", conf);

    if (!classes.empty())
    {
        CV_Assert(classId < (int)classes.size());
        label = classes[classId] + ": " + label;
    }
    int baseLine;
    Size labelSize = getTextSize(label, FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);
    top = max(top, labelSize.height);
    rectangle(frame, Point(left, top - labelSize.height),
              Point(left + labelSize.width, top + baseLine), Scalar::all(255), FILLED);
    putText(frame, label, Point(left, top), FONT_HERSHEY_SIMPLEX, 0.5, Scalar());
}